

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

int pulse_stream_start(cubeb_stream_conflict *stm)

{
  _func_void_pa_mainloop_api_ptr__func_void_pa_mainloop_api_ptr_void_ptr_ptr_void_ptr *p_Var1;
  pa_mainloop_api *ppVar2;
  
  stm->shutdown = 0;
  stream_cork(stm,NOTIFY);
  if ((stm->output_stream != (pa_stream *)0x0) && (stm->input_stream == (pa_stream *)0x0)) {
    (*cubeb_pa_threaded_mainloop_lock)(stm->context->mainloop);
    p_Var1 = cubeb_pa_mainloop_api_once;
    ppVar2 = (*cubeb_pa_threaded_mainloop_get_api)(stm->context->mainloop);
    (*p_Var1)(ppVar2,pulse_defer_event_cb,stm);
    (*cubeb_pa_threaded_mainloop_unlock)(stm->context->mainloop);
  }
  if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (g_cubeb_log_level != CUBEB_LOG_DISABLED)
     ) {
    (*g_cubeb_log_callback)
              ("%s:%d: Cubeb stream (%p) started successfully.\n","cubeb_pulse.c",0x456,stm);
  }
  return 0;
}

Assistant:

static int
pulse_stream_start(cubeb_stream * stm)
{
  stm->shutdown = 0;
  stream_cork(stm, UNCORK | NOTIFY);

  if (stm->output_stream && !stm->input_stream) {
    /* On output only case need to manually call user cb once in order to make
     * things roll. This is done via a defer event in order to execute it
     * from PA server thread. */
    WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
    WRAP(pa_mainloop_api_once)
    (WRAP(pa_threaded_mainloop_get_api)(stm->context->mainloop),
     pulse_defer_event_cb, stm);
    WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);
  }

  LOG("Cubeb stream (%p) started successfully.", stm);
  return CUBEB_OK;
}